

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortByPTypeProcess.cpp
# Opt level: O3

void UpdateNodes(vector<unsigned_int,_std::allocator<unsigned_int>_> *replaceMeshIndex,aiNode *node)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  uint m_1;
  uint *puVar4;
  uint m;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  
  uVar2 = node->mNumMeshes;
  if ((ulong)uVar2 != 0) {
    puVar4 = node->mMeshes;
    uVar5 = 0;
    uVar7 = 0;
    do {
      puVar1 = (replaceMeshIndex->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start + (puVar4[uVar5] << 2);
      uVar7 = ((uint)(puVar1[3] != 0xffffffff) - (uint)(puVar1[1] == 0xffffffff)) +
              (uint)(puVar1[2] != 0xffffffff) + (uVar7 - (*puVar1 == 0xffffffff)) + 2;
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
    if (uVar7 == 0) {
      if (puVar4 != (uint *)0x0) {
        operator_delete__(puVar4);
      }
      node->mNumMeshes = 0;
      puVar4 = (uint *)0x0;
    }
    else {
      if (uVar2 < uVar7) {
        puVar4 = (uint *)operator_new__((ulong)uVar7 * 4);
      }
      uVar5 = 0;
      do {
        uVar2 = node->mMeshes[uVar5];
        lVar6 = 0;
        do {
          uVar3 = (replaceMeshIndex->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  )._M_impl.super__Vector_impl_data._M_start[(ulong)(uVar2 << 2) + lVar6];
          if (uVar3 != 0xffffffff) {
            *puVar4 = uVar3;
            puVar4 = puVar4 + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        uVar5 = uVar5 + 1;
      } while (uVar5 < node->mNumMeshes);
      if ((node->mNumMeshes < uVar7) && (node->mMeshes != (uint *)0x0)) {
        operator_delete__(node->mMeshes);
      }
      node->mNumMeshes = uVar7;
      puVar4 = puVar4 + -(ulong)uVar7;
    }
    node->mMeshes = puVar4;
  }
  if (node->mNumChildren != 0) {
    uVar5 = 0;
    do {
      UpdateNodes(replaceMeshIndex,node->mChildren[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar5 < node->mNumChildren);
  }
  return;
}

Assistant:

void UpdateNodes(const std::vector<unsigned int>& replaceMeshIndex, aiNode* node)
{
    if (node->mNumMeshes)
    {
        unsigned int newSize = 0;
        for (unsigned int m = 0; m< node->mNumMeshes; ++m)
        {
            unsigned int add = node->mMeshes[m]<<2;
            for (unsigned int i = 0; i < 4;++i)
            {
                if (UINT_MAX != replaceMeshIndex[add+i])++newSize;
            }
        }
        if (!newSize)
        {
            delete[] node->mMeshes;
            node->mNumMeshes = 0;
            node->mMeshes    = NULL;
        }
        else
        {
            // Try to reuse the old array if possible
            unsigned int* newMeshes = (newSize > node->mNumMeshes
                ? new unsigned int[newSize] : node->mMeshes);

            for (unsigned int m = 0; m< node->mNumMeshes; ++m)
            {
                unsigned int add = node->mMeshes[m]<<2;
                for (unsigned int i = 0; i < 4;++i)
                {
                    if (UINT_MAX != replaceMeshIndex[add+i])
                        *newMeshes++ = replaceMeshIndex[add+i];
                }
            }
            if (newSize > node->mNumMeshes)
                delete[] node->mMeshes;

            node->mMeshes = newMeshes-(node->mNumMeshes = newSize);
        }
    }

    // call all subnodes recursively
    for (unsigned int m = 0; m < node->mNumChildren; ++m)
        UpdateNodes(replaceMeshIndex,node->mChildren[m]);
}